

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_dbref(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  void *pvVar6;
  void *pvVar7;
  char *pcVar8;
  char *pcVar9;
  undefined8 extraout_RAX;
  undefined1 *__n;
  undefined1 *puVar10;
  undefined8 uVar11;
  undefined1 *puVar12;
  undefined8 extraout_RAX_00;
  void *__s2;
  undefined1 *puVar13;
  undefined8 extraout_RAX_01;
  int *__haystack;
  undefined8 extraout_RAX_02;
  long *plVar14;
  undefined8 extraout_RAX_03;
  undefined8 uVar15;
  undefined8 uVar16;
  long lVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  undefined **ppuVar21;
  char *pcVar22;
  undefined **ppuVar23;
  void *pvVar24;
  int *piVar25;
  undefined **ppuVar26;
  int *piVar27;
  double dVar28;
  int extraout_XMM0_Db;
  dbref_test_t tests [4];
  bson_t b;
  bson_error_t error;
  code **ppcVar29;
  undefined4 uStack_395c;
  undefined8 uStack_3958;
  undefined2 uStack_3950;
  int iStack_3948;
  int iStack_3944;
  char acStack_3940 [504];
  code *pcStack_3748;
  undefined1 auStack_3738 [512];
  char *pcStack_3538;
  code *pcStack_3530;
  int iStack_3520;
  int iStack_351c;
  char acStack_3518 [504];
  long *plStack_3320;
  char *pcStack_3318;
  char *pcStack_3310;
  undefined **ppuStack_3308;
  long lStack_3290;
  long lStack_3288;
  undefined1 auStack_3280 [128];
  undefined1 auStack_3200 [232];
  undefined1 auStack_3118 [608];
  long *plStack_2eb8;
  code *pcStack_2eb0;
  undefined1 auStack_2ea8 [8];
  char acStack_2ea0 [16];
  char *pcStack_2e90;
  code *pcStack_2e88;
  uint uStack_2e04;
  undefined8 uStack_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 uStack_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 uStack_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 uStack_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined1 auStack_2d38 [648];
  int *piStack_2ab0;
  char *pcStack_2aa8;
  undefined **ppuStack_2aa0;
  undefined1 *puStack_2a98;
  undefined **ppuStack_2a90;
  code *pcStack_2a88;
  undefined1 auStack_2a80 [240];
  undefined1 auStack_2990 [648];
  code *apcStack_2708 [16];
  undefined *puStack_2688;
  undefined1 auStack_2680 [200];
  int iStack_25b8;
  int iStack_25b4;
  int aiStack_25b0 [160];
  int *piStack_2330;
  double *pdStack_2328;
  undefined **ppuStack_2320;
  int *piStack_2318;
  int *piStack_2310;
  code *apcStack_2308 [16];
  double dStack_2288;
  int aiStack_2280 [50];
  int iStack_21b8;
  int iStack_21b4;
  int aiStack_21b0 [160];
  undefined8 uStack_1f30;
  undefined1 *puStack_1f28;
  char *pcStack_1f20;
  char *pcStack_1f18;
  undefined **ppuStack_1f10;
  code *pcStack_1f08;
  int iStack_1f00;
  int iStack_1efc;
  char acStack_1ef8 [504];
  undefined1 auStack_1d00 [336];
  char *pcStack_1bb0;
  undefined1 *puStack_1ba8;
  undefined1 *puStack_1ba0;
  void *pvStack_1b98;
  void *pvStack_1b90;
  code *pcStack_1b88;
  undefined1 auStack_1b80 [128];
  char acStack_1b00 [232];
  undefined1 auStack_1a18 [648];
  char *pcStack_1790;
  code *pcStack_1788;
  undefined1 auStack_1780 [128];
  char acStack_1700 [224];
  int iStack_1620;
  int iStack_161c;
  char acStack_1618 [640];
  char *pcStack_1398;
  void *pvStack_1390;
  code *pcStack_1388;
  undefined1 auStack_1380 [128];
  char acStack_1300 [232];
  undefined1 auStack_1218 [648];
  char *pcStack_f90;
  code *pcStack_f88;
  undefined1 auStack_f80 [232];
  int iStack_e98;
  int iStack_e94;
  char acStack_e90 [640];
  char *pcStack_c10;
  code *apcStack_c08 [16];
  uint uStack_b84;
  undefined1 auStack_b80 [4];
  uint uStack_b7c;
  undefined1 auStack_ab8 [648];
  undefined1 *puStack_830;
  undefined1 *puStack_828;
  undefined1 *puStack_820;
  void *pvStack_818;
  void *pvStack_810;
  code *pcStack_808;
  uint uStack_7fc;
  void *pvStack_7f8;
  char *pcStack_7f0;
  void *pvStack_7e8;
  char *pcStack_7e0;
  void *pvStack_7d8;
  char *pcStack_7d0;
  undefined1 *puStack_7c8;
  char *pcStack_7c0;
  undefined1 *puStack_7b8;
  char *pcStack_7b0;
  undefined8 uStack_7a8;
  char *pcStack_7a0;
  undefined8 uStack_798;
  char *pcStack_790;
  undefined8 uStack_788;
  undefined1 auStack_780 [4];
  uint uStack_77c;
  undefined1 auStack_6b8 [592];
  undefined8 uStack_468;
  char *pcStack_460;
  char *pcStack_458;
  char *pcStack_450;
  char *pcStack_448;
  char *pcStack_440;
  char *pcStack_438;
  char *pcStack_430;
  char *pcStack_428;
  char *pcStack_420;
  char *pcStack_418;
  char *pcStack_410;
  code *apcStack_408 [7];
  undefined8 local_3d0;
  void *local_3c8;
  char *local_3c0;
  void *local_3b8;
  char *local_3b0;
  undefined8 local_3a8;
  char *local_3a0;
  void *local_398;
  char *local_390;
  undefined8 local_388;
  char local_380 [4];
  uint local_37c;
  undefined1 local_2b8 [648];
  
  apcStack_408[0] = (code *)0x132590;
  uVar5 = bson_bcon_magic();
  if (oid_zero_initialized == '\0') {
    apcStack_408[0] = (code *)0x1325af;
    bson_oid_init_from_string(oid_zero_oid,"000000000000000000000000");
    oid_zero_initialized = '\x01';
  }
  pvVar24 = (void *)0x0;
  pcVar22 = "$ref";
  pcStack_410 = (char *)0x0;
  pcStack_418 = "}";
  pcStack_420 = oid_zero_oid;
  pcStack_428 = (char *)0x6;
  pcStack_438 = "$id";
  pcStack_440 = "collection";
  pcStack_448 = (char *)0x132610;
  pcStack_430 = (char *)uVar5;
  local_3c8 = (void *)bcon_new(0,"key","{","$ref",uVar5,0);
  pcStack_410 = (char *)0x0;
  pcStack_418 = "}";
  pcStack_420 = (char *)0x1;
  pcStack_428 = (char *)0xf;
  pcStack_438 = "$id";
  pcStack_440 = "collection";
  pcStack_448 = (char *)0x132660;
  pcStack_430 = (char *)uVar5;
  local_3d0 = bcon_new(0,"key","{","$ref",uVar5,0);
  apcStack_408[0] = (code *)0x0;
  pcStack_410 = "}";
  pcStack_418 = "}";
  pcStack_420 = (char *)0x1;
  pcStack_428 = (char *)0xf;
  pcStack_438 = "a";
  pcStack_440 = "{";
  pcStack_448 = "$id";
  pcStack_450 = "collection";
  pcStack_458 = (char *)0x1326b8;
  pcStack_430 = (char *)uVar5;
  pvVar6 = (void *)bcon_new(0,"key","{","$ref",uVar5,0);
  pcStack_410 = (char *)0x0;
  pcStack_418 = "}";
  pcStack_420 = (char *)0x1;
  pcStack_428 = (char *)0x7;
  pcStack_438 = "meta";
  pcStack_440 = (char *)0x1;
  pcStack_448 = (char *)0xf;
  pcStack_458 = "$id";
  pcStack_460 = "collection";
  uStack_468 = 0x13271b;
  pcStack_450 = (char *)uVar5;
  pcStack_430 = (char *)uVar5;
  local_388 = bcon_new(0,"key","{","$ref",uVar5,0);
  local_3c0 = 
  "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";
  local_3b8 = local_3c8;
  local_3b0 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1}}";
  local_3a8 = local_3d0;
  local_3a0 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"a\": 1}}}";
  local_398 = pvVar6;
  local_390 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1,\"meta\": true}}";
  pcVar8 = "key";
  while( true ) {
    apcStack_408[0] = (code *)0x132791;
    cVar1 = bson_init_from_json(local_380,*(undefined8 *)((long)&local_3c0 + (long)pvVar24),
                                0xffffffffffffffff,local_2b8);
    pcVar19 = local_380;
    pvVar7 = pvVar24;
    if (cVar1 == '\0') break;
    apcStack_408[0] = (code *)0x1327a4;
    local_3c8 = (void *)bson_get_data(local_380);
    pcVar19 = *(char **)((long)&local_3b8 + (long)pvVar24);
    apcStack_408[0] = (code *)0x1327b6;
    pvVar7 = (void *)bson_get_data(pcVar19);
    if (*(uint *)(pcVar19 + 4) != local_37c) {
LAB_0013282b:
      pcVar22 = local_380;
      apcStack_408[0] = (code *)0x13283d;
      pcVar8 = (char *)bson_as_canonical_extended_json(pcVar22);
      apcStack_408[0] = (code *)0x13284a;
      uVar5 = bson_as_canonical_extended_json(pcVar19);
      pvVar6 = local_3c8;
      uVar3 = *(uint *)(pcVar19 + 4);
      if (local_37c == 0) goto LAB_00132879;
      uVar18 = 0;
      goto LAB_00132860;
    }
    apcStack_408[0] = (code *)0x1327cd;
    pcVar22 = (char *)bson_get_data(pcVar19);
    apcStack_408[0] = (code *)0x1327d8;
    pvVar6 = (void *)bson_get_data(local_380);
    apcStack_408[0] = (code *)0x1327e6;
    iVar2 = bcmp(pcVar22,pvVar6,(ulong)*(uint *)(pcVar19 + 4));
    if (iVar2 != 0) goto LAB_0013282b;
    apcStack_408[0] = (code *)0x1327f5;
    bson_destroy(local_380);
    pvVar24 = (void *)((long)pvVar24 + 0x10);
    pcVar8 = local_380;
    pvVar6 = pvVar7;
    if (pvVar24 == (void *)0x40) {
      lVar17 = 8;
      do {
        apcStack_408[0] = (code *)0x132812;
        bson_destroy(*(undefined8 *)((long)&local_3c0 + lVar17));
        lVar17 = lVar17 + 0x10;
      } while (lVar17 != 0x48);
      return;
    }
  }
  goto LAB_0013293d;
  while( true ) {
    if (*(char *)((long)local_3c8 + uVar18) != *(char *)((long)pvVar7 + uVar18)) goto LAB_00132922;
    uVar18 = uVar18 + 1;
    if (local_37c == (uint)uVar18) break;
LAB_00132860:
    if (uVar3 == (uint)uVar18) break;
  }
LAB_00132879:
  uVar4 = local_37c;
  if (local_37c < uVar3) {
    uVar4 = uVar3;
  }
  uVar18 = (ulong)(uVar4 - 1);
  while( true ) {
    apcStack_408[0] = (code *)0x13289e;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar18,pcVar8,uVar5);
    apcStack_408[0] = (code *)0x1328b6;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar8 = (char *)(ulong)uVar3;
    apcStack_408[0] = (code *)0x1328d1;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    local_3d0 = CONCAT44(local_3d0._4_4_,uVar3);
    if (uVar3 == 0xffffffff) break;
    pcVar22 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013292e;
    pcVar8 = (char *)(ulong)local_37c;
    apcStack_408[0] = (code *)0x1328fb;
    pcVar9 = (char *)write(uVar3,pvVar6,(size_t)pcVar8);
    if (pcVar9 != pcVar8) goto LAB_00132933;
    pcVar19 = (char *)(ulong)*(uint *)(pcVar19 + 4);
    apcStack_408[0] = (code *)0x132911;
    pcVar9 = (char *)write(uVar4,pvVar7,(size_t)pcVar19);
    if (pcVar9 != pcVar19) goto LAB_00132938;
    uVar18 = (ulong)uVar4;
    apcStack_408[0] = (code *)0x132922;
    test_bson_json_dbref_cold_4();
    uVar5 = extraout_RAX;
LAB_00132922:
    uVar18 = uVar18 & 0xffffffff;
  }
  apcStack_408[0] = (code *)0x13292e;
  test_bson_json_dbref_cold_6();
LAB_0013292e:
  apcStack_408[0] = (code *)0x132933;
  test_bson_json_dbref_cold_5();
LAB_00132933:
  apcStack_408[0] = (code *)0x132938;
  test_bson_json_dbref_cold_2();
LAB_00132938:
  apcStack_408[0] = (code *)0x13293d;
  test_bson_json_dbref_cold_3();
LAB_0013293d:
  apcStack_408[0] = test_bson_json_uescape;
  test_bson_json_dbref_cold_1();
  pcStack_808 = (code *)0x132967;
  pcStack_430 = pcVar19;
  pcStack_428 = pcVar8;
  pcStack_420 = pcVar22;
  pcStack_418 = (char *)pvVar7;
  pcStack_410 = (char *)pvVar6;
  apcStack_408[0] = (code *)&stack0xfffffffffffffff8;
  uVar5 = bson_bcon_magic();
  pcStack_808 = (code *)0x132989;
  pvStack_7f8 = (void *)bcon_new(0,"euro",uVar5,0,anon_var_dwarf_48e4 + 0xc,0);
  pcStack_808 = (code *)0x1329ad;
  pvVar6 = (void *)bcon_new(0,"crlf",uVar5,0,"\r\n",0);
  pcStack_808 = (code *)0x1329cf;
  __n = (undefined1 *)bcon_new(0,"quote",uVar5,0,"\"",0);
  pcStack_808 = (code *)0x1329f1;
  puVar10 = (undefined1 *)bcon_new(0,"backslash",uVar5,0,"\\",0);
  pcStack_808 = (code *)0x132a0f;
  uVar11 = bcon_new(0,"",uVar5,0,"",0);
  pcStack_808 = (code *)0x132a31;
  uVar5 = bcon_new(0,"escapes",uVar5,0,"\f\b\t",0);
  pcStack_808 = (code *)0x132a39;
  uStack_788 = bson_new();
  pcStack_7f0 = "{ \"euro\": \"\\u20AC\"}";
  pvStack_7e8 = pvStack_7f8;
  pcStack_7e0 = "{ \"crlf\": \"\\r\\n\"}";
  pcStack_7d0 = "{ \"quote\": \"\\\"\"}";
  pcStack_7c0 = "{ \"backslash\": \"\\\\\"}";
  pcStack_7b0 = "{ \"\": \"\"}";
  pcStack_7a0 = "{ \"escapes\": \"\\f\\b\\t\"}";
  pcStack_790 = "{ \"nil\": \"\\u0000\"}";
  pcStack_808 = (code *)0x132ad6;
  pvStack_7d8 = pvVar6;
  puStack_7c8 = __n;
  puStack_7b8 = puVar10;
  uStack_7a8 = uVar11;
  uStack_798 = uVar5;
  bson_append_utf8(uStack_788,"nil",0xffffffff,"",1);
  pvVar24 = (void *)0x8;
  while( true ) {
    pcStack_808 = (code *)0x132b00;
    cVar1 = bson_init_from_json(auStack_780,*(undefined8 *)((long)&pvStack_7f8 + (long)pvVar24),
                                0xffffffffffffffff,auStack_6b8);
    puVar13 = auStack_780;
    pvVar7 = pvVar24;
    if (cVar1 == '\0') break;
    pcStack_808 = (code *)0x132b13;
    pvStack_7f8 = (void *)bson_get_data(auStack_780);
    puVar13 = *(undefined1 **)((long)&pcStack_7f0 + (long)pvVar24);
    pcStack_808 = (code *)0x132b25;
    pvVar7 = (void *)bson_get_data(puVar13);
    if (*(uint *)(puVar13 + 4) != uStack_77c) {
LAB_00132b9a:
      puVar10 = auStack_780;
      pcStack_808 = (code *)0x132bac;
      __n = (undefined1 *)bson_as_canonical_extended_json(puVar10);
      pcStack_808 = (code *)0x132bb9;
      uVar5 = bson_as_canonical_extended_json(puVar13);
      pvVar6 = pvStack_7f8;
      uVar3 = *(uint *)(puVar13 + 4);
      if (uStack_77c == 0) goto LAB_00132be8;
      uVar18 = 0;
      goto LAB_00132bcf;
    }
    pcStack_808 = (code *)0x132b3c;
    puVar10 = (undefined1 *)bson_get_data(puVar13);
    pcStack_808 = (code *)0x132b47;
    pvVar6 = (void *)bson_get_data(auStack_780);
    pcStack_808 = (code *)0x132b55;
    iVar2 = bcmp(puVar10,pvVar6,(ulong)*(uint *)(puVar13 + 4));
    if (iVar2 != 0) goto LAB_00132b9a;
    pcStack_808 = (code *)0x132b64;
    bson_destroy(auStack_780);
    pvVar24 = (void *)((long)pvVar24 + 0x10);
    __n = auStack_780;
    pvVar6 = pvVar7;
    if (pvVar24 == (void *)0x78) {
      lVar17 = 8;
      do {
        pcStack_808 = (code *)0x132b81;
        bson_destroy(*(undefined8 *)((long)&pcStack_7f0 + lVar17));
        lVar17 = lVar17 + 0x10;
      } while (lVar17 != 0x78);
      return;
    }
  }
LAB_00132cac:
  pcStack_808 = test_bson_json_uescape_key;
  test_bson_json_uescape_cold_1();
  apcStack_c08[0] = (code *)0x132cd6;
  puStack_830 = puVar13;
  puStack_828 = __n;
  puStack_820 = puVar10;
  pvStack_818 = pvVar7;
  pvStack_810 = pvVar6;
  pcStack_808 = (code *)apcStack_408;
  uVar5 = bson_bcon_magic();
  apcStack_c08[0] = (code *)0x132cf5;
  pcVar22 = (char *)bcon_new(0,anon_var_dwarf_48e4 + 0xc,uVar5,0,"euro",0);
  apcStack_c08[0] = (code *)0x132d1b;
  cVar1 = bson_init_from_json(auStack_b80,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,auStack_ab8)
  ;
  if (cVar1 == '\0') {
    apcStack_c08[0] = (code *)0x132e94;
    test_bson_json_uescape_key_cold_1();
  }
  else {
    apcStack_c08[0] = (code *)0x132d33;
    pvVar6 = (void *)bson_get_data(auStack_b80);
    apcStack_c08[0] = (code *)0x132d3e;
    pvVar7 = (void *)bson_get_data(pcVar22);
    if (*(uint *)(pcVar22 + 4) == uStack_b7c) {
      apcStack_c08[0] = (code *)0x132d53;
      pvVar24 = (void *)bson_get_data(pcVar22);
      apcStack_c08[0] = (code *)0x132d63;
      __s2 = (void *)bson_get_data(auStack_b80);
      apcStack_c08[0] = (code *)0x132d71;
      iVar2 = bcmp(pvVar24,__s2,(ulong)*(uint *)(pcVar22 + 4));
      if (iVar2 == 0) {
        apcStack_c08[0] = (code *)0x132d82;
        bson_destroy(auStack_b80);
        apcStack_c08[0] = (code *)0x132d8a;
        bson_destroy(pcVar22);
        return;
      }
    }
    puVar10 = auStack_b80;
    apcStack_c08[0] = (code *)0x132dab;
    __n = (undefined1 *)bson_as_canonical_extended_json(puVar10);
    apcStack_c08[0] = (code *)0x132db8;
    uVar5 = bson_as_canonical_extended_json(pcVar22);
    uVar3 = *(uint *)(pcVar22 + 4);
    if (uStack_b7c != 0) {
      uVar18 = 0;
      do {
        if (uVar3 == (uint)uVar18) break;
        if (*(char *)((long)pvVar6 + uVar18) != *(char *)((long)pvVar7 + uVar18)) goto LAB_00132e88;
        uVar18 = uVar18 + 1;
      } while (uStack_b7c != (uint)uVar18);
    }
    uVar4 = uStack_b7c;
    if (uStack_b7c < uVar3) {
      uVar4 = uVar3;
    }
    uVar18 = (ulong)(uVar4 - 1);
    while( true ) {
      apcStack_c08[0] = (code *)0x132e04;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar18,__n,uVar5);
      apcStack_c08[0] = (code *)0x132e1c;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      __n = (undefined1 *)(ulong)uVar3;
      apcStack_c08[0] = (code *)0x132e37;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_b84 = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar10 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_00132e99;
      __n = (undefined1 *)(ulong)uStack_b7c;
      apcStack_c08[0] = (code *)0x132e61;
      puVar13 = (undefined1 *)write(uVar3,pvVar6,(size_t)__n);
      if (puVar13 != __n) goto LAB_00132e9e;
      pcVar22 = (char *)(ulong)*(uint *)(pcVar22 + 4);
      apcStack_c08[0] = (code *)0x132e77;
      pcVar8 = (char *)write(uVar4,pvVar7,(size_t)pcVar22);
      if (pcVar8 != pcVar22) goto LAB_00132ea3;
      uVar18 = (ulong)uVar4;
      apcStack_c08[0] = (code *)0x132e88;
      test_bson_json_uescape_key_cold_4();
      uVar5 = extraout_RAX_01;
LAB_00132e88:
      uVar18 = uVar18 & 0xffffffff;
    }
  }
  apcStack_c08[0] = (code *)0x132e99;
  test_bson_json_uescape_key_cold_6();
LAB_00132e99:
  apcStack_c08[0] = (code *)0x132e9e;
  test_bson_json_uescape_key_cold_5();
LAB_00132e9e:
  apcStack_c08[0] = (code *)0x132ea3;
  test_bson_json_uescape_key_cold_2();
LAB_00132ea3:
  apcStack_c08[0] = test_bson_json_uescape_bad;
  test_bson_json_uescape_key_cold_3();
  pcStack_f88 = (code *)0x132ed6;
  pcStack_c10 = pcVar22;
  apcStack_c08[0] = (code *)&pcStack_808;
  cVar1 = bson_init_from_json(auStack_f80,"{ \"bad\": \"\\u1\"}",0xffffffffffffffff,&iStack_e98);
  if (cVar1 == '\0') {
    if (iStack_e98 != 1) goto LAB_00132f22;
    if (iStack_e94 != 1) goto LAB_00132f27;
    pcVar22 = acStack_e90;
    pcStack_f88 = (code *)0x132f09;
    pcVar8 = strstr(pcVar22,"UESCAPE_TOOSHORT");
    if (pcVar8 != (char *)0x0) {
      pcStack_f88 = (code *)0x132f16;
      bson_destroy(auStack_f80);
      return;
    }
  }
  else {
    pcStack_f88 = (code *)0x132f22;
    test_bson_json_uescape_bad_cold_4();
LAB_00132f22:
    pcStack_f88 = (code *)0x132f27;
    test_bson_json_uescape_bad_cold_1();
LAB_00132f27:
    pcStack_f88 = (code *)0x132f2c;
    test_bson_json_uescape_bad_cold_2();
  }
  pcStack_f88 = test_bson_json_int32;
  test_bson_json_uescape_bad_cold_3();
  pcStack_1388 = (code *)0x132f67;
  pcStack_f90 = pcVar22;
  pcStack_f88 = (code *)apcStack_c08;
  cVar1 = bson_init_from_json(acStack_1300,"{ \"x\": 2147483647 }",0xffffffffffffffff,auStack_1218);
  if (cVar1 == '\0') {
LAB_00133159:
    pcStack_1388 = (code *)0x133166;
    test_bson_json_int32_cold_1();
LAB_00133166:
    pcStack_1388 = (code *)0x13316e;
    test_bson_json_int32_cold_4();
LAB_0013316e:
    pcStack_1388 = (code *)0x13317b;
    test_bson_json_int32_cold_5();
  }
  else {
    pcStack_1388 = (code *)0x132f86;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') {
      pcStack_1388 = (code *)0x133136;
      test_bson_json_int32_cold_2();
LAB_00133136:
      pcStack_1388 = (code *)0x13313b;
      test_bson_json_int32_cold_3();
LAB_0013313b:
      pcStack_1388 = (code *)0x133140;
      test_bson_json_int32_cold_6();
LAB_00133140:
      pcStack_1388 = (code *)0x133145;
      test_bson_json_int32_cold_7();
      pcStack_1388 = (code *)0x13314a;
      test_bson_json_int32_cold_10();
      pcStack_1388 = (code *)0x13314f;
      test_bson_json_int32_cold_11();
      pcStack_1388 = (code *)0x133154;
      test_bson_json_int32_cold_14();
      pcStack_1388 = (code *)0x133159;
      test_bson_json_int32_cold_15();
      goto LAB_00133159;
    }
    pcStack_1388 = (code *)0x132f96;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 0x10) goto LAB_00133136;
    pcStack_1388 = (code *)0x132fa7;
    iVar2 = bson_iter_int32(auStack_1380);
    if (iVar2 != 0x7fffffff) goto LAB_00133166;
    pcVar22 = acStack_1300;
    pcStack_1388 = (code *)0x132fc2;
    bson_destroy(pcVar22);
    pcStack_1388 = (code *)0x132fe0;
    cVar1 = bson_init_from_json(pcVar22,"{ \"x\": -2147483648 }",0xffffffffffffffff,auStack_1218);
    if (cVar1 == '\0') goto LAB_0013316e;
    pcStack_1388 = (code *)0x132fff;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') goto LAB_0013313b;
    pcStack_1388 = (code *)0x13300f;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 0x10) goto LAB_00133140;
    pcStack_1388 = (code *)0x133020;
    bson_iter_int32(auStack_1380);
  }
  pcStack_1388 = (code *)0x133183;
  test_bson_json_int32_cold_8();
  pcStack_1388 = (code *)0x133190;
  test_bson_json_int32_cold_9();
  pcStack_1388 = (code *)0x133198;
  test_bson_json_int32_cold_12();
  pcStack_1388 = (code *)0x1331a5;
  test_bson_json_int32_cold_13();
  pcStack_1388 = test_bson_json_int64;
  test_bson_json_int32_cold_16();
  pcStack_1788 = (code *)0x1331e2;
  pcStack_1398 = pcVar22;
  pvStack_1390 = pvVar7;
  pcStack_1388 = (code *)&pcStack_f88;
  cVar1 = bson_init_from_json(acStack_1700,"{ \"x\": 9223372036854775807 }",0xffffffffffffffff,
                              &iStack_1620);
  if (cVar1 == '\0') {
LAB_0013347b:
    pcStack_1788 = (code *)0x133488;
    test_bson_json_int64_cold_1();
LAB_00133488:
    pcStack_1788 = (code *)0x133490;
    test_bson_json_int64_cold_4();
LAB_00133490:
    pcStack_1788 = (code *)0x13349d;
    test_bson_json_int64_cold_5();
LAB_0013349d:
    pcStack_1788 = (code *)0x1334a5;
    test_bson_json_int64_cold_8();
LAB_001334a5:
    pcStack_1788 = (code *)0x1334aa;
    test_bson_json_int64_cold_9();
LAB_001334aa:
    pcStack_1788 = (code *)0x1334af;
    test_bson_json_int64_cold_10();
LAB_001334af:
    pcStack_1788 = (code *)0x1334b7;
    test_bson_json_int64_cold_23();
LAB_001334b7:
    pcStack_1788 = (code *)0x1334bc;
    test_bson_json_int64_cold_11();
LAB_001334bc:
    pcStack_1788 = (code *)0x1334c1;
    test_bson_json_int64_cold_12();
LAB_001334c1:
    pcStack_1788 = (code *)0x1334c9;
    test_bson_json_int64_cold_21();
LAB_001334c9:
    pcStack_1788 = (code *)0x1334ce;
    test_bson_json_int64_cold_13();
LAB_001334ce:
    pcStack_1788 = (code *)0x1334d3;
    test_bson_json_int64_cold_14();
LAB_001334d3:
    pcStack_1788 = (code *)0x1334db;
    test_bson_json_int64_cold_19();
LAB_001334db:
    pcStack_1788 = (code *)0x1334e0;
    test_bson_json_int64_cold_15();
LAB_001334e0:
    pcStack_1788 = (code *)0x1334e5;
    test_bson_json_int64_cold_16();
  }
  else {
    pcStack_1788 = (code *)0x133201;
    cVar1 = bson_iter_init_find(auStack_1780,acStack_1700,"x");
    if (cVar1 == '\0') {
      pcStack_1788 = (code *)0x133458;
      test_bson_json_int64_cold_2();
LAB_00133458:
      pcStack_1788 = (code *)0x13345d;
      test_bson_json_int64_cold_3();
LAB_0013345d:
      pcStack_1788 = (code *)0x133462;
      test_bson_json_int64_cold_6();
LAB_00133462:
      pcStack_1788 = (code *)0x133467;
      test_bson_json_int64_cold_7();
LAB_00133467:
      pcStack_1788 = (code *)0x13346c;
      test_bson_json_int64_cold_24();
LAB_0013346c:
      pcStack_1788 = (code *)0x133471;
      test_bson_json_int64_cold_22();
LAB_00133471:
      pcStack_1788 = (code *)0x133476;
      test_bson_json_int64_cold_20();
LAB_00133476:
      pcStack_1788 = (code *)0x13347b;
      test_bson_json_int64_cold_18();
      goto LAB_0013347b;
    }
    pcStack_1788 = (code *)0x133211;
    iVar2 = bson_iter_type(auStack_1780);
    if (iVar2 != 0x12) goto LAB_00133458;
    pvVar7 = (void *)0x7fffffffffffffff;
    pcStack_1788 = (code *)0x13322c;
    lVar17 = bson_iter_int64(auStack_1780);
    if (lVar17 != 0x7fffffffffffffff) goto LAB_00133488;
    pcVar22 = acStack_1700;
    pcStack_1788 = (code *)0x133245;
    bson_destroy(pcVar22);
    pcStack_1788 = (code *)0x133263;
    cVar1 = bson_init_from_json(pcVar22,"{ \"x\": -9223372036854775808 }",0xffffffffffffffff,
                                &iStack_1620);
    if (cVar1 == '\0') goto LAB_00133490;
    pcStack_1788 = (code *)0x133282;
    cVar1 = bson_iter_init_find(auStack_1780,acStack_1700,"x");
    if (cVar1 == '\0') goto LAB_0013345d;
    pcStack_1788 = (code *)0x133292;
    iVar2 = bson_iter_type(auStack_1780);
    if (iVar2 != 0x12) goto LAB_00133462;
    pcStack_1788 = (code *)0x1332a3;
    lVar17 = bson_iter_int64(auStack_1780);
    pvVar7 = (void *)0x8000000000000000;
    if (lVar17 != -0x8000000000000000) goto LAB_0013349d;
    pcVar22 = acStack_1700;
    pcStack_1788 = (code *)0x1332bf;
    bson_destroy(pcVar22);
    pcStack_1788 = (code *)0x1332dd;
    cVar1 = bson_init_from_json(pcVar22,"{ \"x\": 9223372036854775808 }",0xffffffffffffffff,
                                &iStack_1620);
    if (cVar1 != '\0') goto LAB_00133467;
    if (iStack_1620 != 1) goto LAB_001334a5;
    if (iStack_161c != 2) goto LAB_001334aa;
    pcVar22 = acStack_1618;
    pcStack_1788 = (code *)0x13331c;
    pcVar8 = strstr(pcVar22,"Number \"9223372036854775808\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_001334af;
    pcStack_1788 = (code *)0x133348;
    cVar1 = bson_init_from_json(acStack_1700,"{ \"x\": -9223372036854775809 }",0xffffffffffffffff,
                                &iStack_1620);
    if (cVar1 != '\0') goto LAB_0013346c;
    if (iStack_1620 != 1) goto LAB_001334b7;
    if (iStack_161c != 2) goto LAB_001334bc;
    pcStack_1788 = (code *)0x13337f;
    pcVar8 = strstr(pcVar22,"Number \"-9223372036854775809\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_001334c1;
    pcStack_1788 = (code *)0x1333ab;
    cVar1 = bson_init_from_json(acStack_1700,"{ \"x\": 10000000000000000000 }",0xffffffffffffffff,
                                &iStack_1620);
    if (cVar1 != '\0') goto LAB_00133471;
    if (iStack_1620 != 1) goto LAB_001334c9;
    if (iStack_161c != 2) goto LAB_001334ce;
    pcStack_1788 = (code *)0x1333e2;
    pcVar8 = strstr(pcVar22,"Number \"10000000000000000000\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_001334d3;
    pcStack_1788 = (code *)0x13340e;
    cVar1 = bson_init_from_json(acStack_1700,"{ \"x\": -10000000000000000000 }",0xffffffffffffffff,
                                &iStack_1620);
    if (cVar1 != '\0') goto LAB_00133476;
    if (iStack_1620 != 1) goto LAB_001334db;
    if (iStack_161c != 2) goto LAB_001334e0;
    pcStack_1788 = (code *)0x133441;
    pcVar8 = strstr(pcVar22,"Number \"-10000000000000000000\" is out of range");
    if (pcVar8 != (char *)0x0) {
      return;
    }
  }
  pcStack_1788 = test_bson_json_double;
  test_bson_json_int64_cold_17();
  pcStack_1b88 = (code *)0x133520;
  pcStack_1790 = pcVar22;
  pcStack_1788 = (code *)&pcStack_1388;
  cVar1 = bson_init_from_json(acStack_1b00,"{ \"x\": 1 }",0xffffffffffffffff,auStack_1a18);
  if (cVar1 == '\0') {
LAB_001337c5:
    pcStack_1b88 = (code *)0x1337d2;
    test_bson_json_double_cold_1();
LAB_001337d2:
    pcStack_1b88 = (code *)0x1337da;
    test_bson_json_double_cold_4();
LAB_001337da:
    pcStack_1b88 = (code *)0x1337e7;
    test_bson_json_double_cold_5();
LAB_001337e7:
    pcStack_1b88 = (code *)0x1337ef;
    test_bson_json_double_cold_8();
LAB_001337ef:
    pcStack_1b88 = (code *)0x1337fc;
    test_bson_json_double_cold_9();
LAB_001337fc:
    pcStack_1b88 = (code *)0x133804;
    test_bson_json_double_cold_12();
LAB_00133804:
    pcStack_1b88 = (code *)0x133811;
    test_bson_json_double_cold_13();
LAB_00133811:
    pcStack_1b88 = (code *)0x133819;
    test_bson_json_double_cold_16();
LAB_00133819:
    pcStack_1b88 = (code *)0x133826;
    test_bson_json_double_cold_17();
  }
  else {
    pcStack_1b88 = (code *)0x13353f;
    cVar1 = bson_iter_init_find(auStack_1b80,acStack_1b00,"x");
    if (cVar1 == '\0') {
      pcStack_1b88 = (code *)0x133793;
      test_bson_json_double_cold_2();
LAB_00133793:
      pcStack_1b88 = (code *)0x133798;
      test_bson_json_double_cold_3();
LAB_00133798:
      pcStack_1b88 = (code *)0x13379d;
      test_bson_json_double_cold_6();
LAB_0013379d:
      pcStack_1b88 = (code *)0x1337a2;
      test_bson_json_double_cold_7();
LAB_001337a2:
      pcStack_1b88 = (code *)0x1337a7;
      test_bson_json_double_cold_10();
LAB_001337a7:
      pcStack_1b88 = (code *)0x1337ac;
      test_bson_json_double_cold_11();
LAB_001337ac:
      pcStack_1b88 = (code *)0x1337b1;
      test_bson_json_double_cold_14();
LAB_001337b1:
      pcStack_1b88 = (code *)0x1337b6;
      test_bson_json_double_cold_15();
LAB_001337b6:
      pcStack_1b88 = (code *)0x1337bb;
      test_bson_json_double_cold_18();
LAB_001337bb:
      pcStack_1b88 = (code *)0x1337c0;
      test_bson_json_double_cold_19();
LAB_001337c0:
      pcStack_1b88 = (code *)0x1337c5;
      test_bson_json_double_cold_21();
      goto LAB_001337c5;
    }
    pcStack_1b88 = (code *)0x13354f;
    iVar2 = bson_iter_type(auStack_1b80);
    if (iVar2 != 0x10) goto LAB_00133793;
    pcStack_1b88 = (code *)0x133560;
    iVar2 = bson_iter_int32(auStack_1b80);
    if (iVar2 != 1) goto LAB_001337d2;
    pcVar22 = acStack_1b00;
    pcStack_1b88 = (code *)0x133579;
    bson_destroy(pcVar22);
    pcStack_1b88 = (code *)0x133597;
    cVar1 = bson_init_from_json(pcVar22,"{ \"x\": 4294967296 }",0xffffffffffffffff,auStack_1a18);
    if (cVar1 == '\0') goto LAB_001337da;
    pcStack_1b88 = (code *)0x1335b6;
    cVar1 = bson_iter_init_find(auStack_1b80,acStack_1b00,"x");
    if (cVar1 == '\0') goto LAB_00133798;
    pcStack_1b88 = (code *)0x1335c6;
    iVar2 = bson_iter_type(auStack_1b80);
    if (iVar2 != 0x12) goto LAB_0013379d;
    pcStack_1b88 = (code *)0x1335d7;
    lVar17 = bson_iter_int64(auStack_1b80);
    if (lVar17 != 0x100000000) goto LAB_001337e7;
    pcVar22 = acStack_1b00;
    pcStack_1b88 = (code *)0x1335fa;
    bson_destroy(pcVar22);
    pcStack_1b88 = (code *)0x133618;
    cVar1 = bson_init_from_json(pcVar22,"{ \"x\": 1.0 }",0xffffffffffffffff,auStack_1a18);
    if (cVar1 == '\0') goto LAB_001337ef;
    pcStack_1b88 = (code *)0x133637;
    cVar1 = bson_iter_init_find(auStack_1b80,acStack_1b00,"x");
    if (cVar1 == '\0') goto LAB_001337a2;
    pcStack_1b88 = (code *)0x133647;
    iVar2 = bson_iter_type(auStack_1b80);
    if (iVar2 != 1) goto LAB_001337a7;
    pcStack_1b88 = (code *)0x133658;
    dVar28 = (double)bson_iter_double(auStack_1b80);
    if ((dVar28 != 1.0) || (NAN(dVar28))) goto LAB_001337fc;
    pcVar22 = acStack_1b00;
    pcStack_1b88 = (code *)0x13367c;
    bson_destroy(pcVar22);
    pcStack_1b88 = (code *)0x13369a;
    cVar1 = bson_init_from_json(pcVar22,"{ \"x\": 0.0 }",0xffffffffffffffff,auStack_1a18);
    if (cVar1 == '\0') goto LAB_00133804;
    pcStack_1b88 = (code *)0x1336b9;
    cVar1 = bson_iter_init_find(auStack_1b80,acStack_1b00,"x");
    if (cVar1 == '\0') goto LAB_001337ac;
    pcStack_1b88 = (code *)0x1336c9;
    iVar2 = bson_iter_type(auStack_1b80);
    if (iVar2 != 1) goto LAB_001337b1;
    pcStack_1b88 = (code *)0x1336da;
    dVar28 = (double)bson_iter_double(auStack_1b80);
    if ((dVar28 != 0.0) || (NAN(dVar28))) goto LAB_00133811;
    pcVar22 = acStack_1b00;
    pcStack_1b88 = (code *)0x1336fe;
    bson_destroy(pcVar22);
    pcStack_1b88 = (code *)0x13371c;
    cVar1 = bson_init_from_json(pcVar22,"{ \"x\": -0.0 }",0xffffffffffffffff,auStack_1a18);
    if (cVar1 == '\0') goto LAB_00133819;
    pcStack_1b88 = (code *)0x13373b;
    cVar1 = bson_iter_init_find(auStack_1b80,acStack_1b00,"x");
    if (cVar1 == '\0') goto LAB_001337b6;
    pcStack_1b88 = (code *)0x133747;
    iVar2 = bson_iter_type(auStack_1b80);
    if (iVar2 != 1) goto LAB_001337bb;
    pcStack_1b88 = (code *)0x133754;
    dVar28 = (double)bson_iter_double(auStack_1b80);
    if ((dVar28 == 0.0) && (!NAN(dVar28))) {
      pcStack_1b88 = (code *)0x133770;
      bson_iter_double(auStack_1b80);
      if (extraout_XMM0_Db < 0) {
        pcStack_1b88 = (code *)0x133787;
        bson_destroy(acStack_1b00);
        return;
      }
      goto LAB_001337c0;
    }
  }
  pcStack_1b88 = test_bson_json_double_overflow;
  test_bson_json_double_cold_20();
  pcVar8 = "2e400";
  ppuVar26 = &PTR_anon_var_dwarf_1aedf_00163308;
  pcStack_1bb0 = pcVar22;
  puStack_1ba8 = __n;
  puStack_1ba0 = puVar10;
  pvStack_1b98 = pvVar7;
  pvStack_1b90 = pvVar6;
  pcStack_1b88 = (code *)&pcStack_1788;
  while( true ) {
    pcStack_1f08 = (code *)0x13386c;
    uVar5 = bson_strdup_printf("{ \"d\" : %s }",pcVar8);
    pcStack_1f08 = (code *)0x133889;
    cVar1 = bson_init_from_json(auStack_1d00,uVar5,0xffffffffffffffff,&iStack_1f00);
    if (cVar1 != '\0') break;
    if (iStack_1f00 != 1) goto LAB_00133953;
    if (iStack_1efc != 2) goto LAB_0013394e;
    pcStack_1f08 = (code *)0x1338b7;
    pcVar22 = strstr(acStack_1ef8,"out of range");
    if (pcVar22 == (char *)0x0) goto LAB_00133958;
    pcStack_1f08 = (code *)0x1338c8;
    bson_free(uVar5);
    pcStack_1f08 = (code *)0x1338d9;
    uVar5 = bson_strdup_printf("{ \"d\" : { \"$numberDouble\" : \"%s\" } }",pcVar8);
    pcStack_1f08 = (code *)0x1338f6;
    cVar1 = bson_init_from_json(auStack_1d00,uVar5,0xffffffffffffffff,&iStack_1f00);
    if (cVar1 != '\0') goto LAB_00133949;
    if (iStack_1f00 != 1) goto LAB_00133967;
    if (iStack_1efc != 2) goto LAB_00133962;
    pcStack_1f08 = (code *)0x133918;
    pcVar22 = strstr(acStack_1ef8,"out of range");
    if (pcVar22 == (char *)0x0) goto LAB_0013396c;
    pcStack_1f08 = (code *)0x133925;
    bson_free(uVar5);
    pcVar8 = *ppuVar26;
    ppuVar26 = ppuVar26 + 1;
    if (pcVar8 == (char *)0x0) {
      return;
    }
  }
  pcStack_1f08 = (code *)0x133949;
  test_bson_json_double_overflow_cold_8();
LAB_00133949:
  pcStack_1f08 = (code *)0x13394e;
  test_bson_json_double_overflow_cold_6();
LAB_0013394e:
  pcStack_1f08 = (code *)0x133953;
  test_bson_json_double_overflow_cold_2();
LAB_00133953:
  pcStack_1f08 = (code *)0x133958;
  test_bson_json_double_overflow_cold_1();
LAB_00133958:
  pcStack_1f08 = (code *)0x133962;
  test_bson_json_double_overflow_cold_7();
LAB_00133962:
  pcStack_1f08 = (code *)0x133967;
  test_bson_json_double_overflow_cold_4();
LAB_00133967:
  pcStack_1f08 = (code *)0x13396c;
  test_bson_json_double_overflow_cold_3();
LAB_0013396c:
  pcStack_1f08 = test_bson_json_nan;
  test_bson_json_double_overflow_cold_5();
  pcStack_1f20 = "out of range";
  pcVar19 = "{ \"d\": NaN }";
  ppuVar23 = &PTR_anon_var_dwarf_1af33_00163328;
  __haystack = aiStack_2280;
  piVar25 = &iStack_21b8;
  piVar27 = (int *)0x14c766;
  pcVar22 = (char *)&dStack_2288;
  uStack_1f30 = uVar5;
  puStack_1f28 = (undefined1 *)&iStack_1f00;
  pcStack_1f18 = pcVar8;
  ppuStack_1f10 = ppuVar26;
  pcStack_1f08 = (code *)&pcStack_1b88;
  do {
    apcStack_2308[0] = (code *)0x1339ca;
    cVar1 = bson_init_from_json(__haystack,pcVar19,0xffffffffffffffff,piVar25);
    if (cVar1 == '\0') {
      apcStack_2308[0] = (code *)0x133b2b;
      test_bson_json_nan_cold_1();
LAB_00133b2b:
      apcStack_2308[0] = (code *)0x133b30;
      test_bson_json_nan_cold_2();
LAB_00133b30:
      apcStack_2308[0] = (code *)0x133b35;
      test_bson_json_nan_cold_3();
      goto LAB_00133b35;
    }
    apcStack_2308[0] = (code *)0x1339d7;
    uVar5 = bson_bcone_magic();
    apcStack_2308[0] = (code *)0x1339f2;
    cVar1 = bcon_extract(__haystack,"d",uVar5,1,pcVar22,0);
    if (cVar1 == '\0') goto LAB_00133b2b;
    if (!NAN(dStack_2288) && !NAN(dStack_2288)) goto LAB_00133b30;
    apcStack_2308[0] = (code *)0x133a12;
    bson_destroy(__haystack);
    pcVar19 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
  } while (pcVar19 != (char *)0x0);
  pcVar8 = "{ \"d\": NaNn }";
  ppuVar23 = &PTR_anon_var_dwarf_1af63_00163358;
  __haystack = aiStack_21b0;
  piVar25 = aiStack_2280;
  piVar27 = &iStack_21b8;
  pcVar22 = "Got parse error at";
  do {
    apcStack_2308[0] = (code *)0x133a5e;
    cVar1 = bson_init_from_json(piVar25,pcVar8,0xffffffffffffffff,piVar27);
    if (cVar1 != '\0') goto LAB_00133b35;
    if (iStack_21b8 != 1) goto LAB_00133b4c;
    if (iStack_21b4 != 1) goto LAB_00133b3f;
    apcStack_2308[0] = (code *)0x133a91;
    pcVar8 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar8 == (char *)0x0) goto LAB_00133b44;
    pcVar8 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
  } while (pcVar8 != (char *)0x0);
  pcVar8 = "{ \"d\": nu";
  ppuVar23 = &PTR_anon_var_dwarf_1afab_00163398;
  piVar25 = aiStack_2280;
  piVar27 = &iStack_21b8;
  pcVar22 = "Incomplete JSON";
  while( true ) {
    apcStack_2308[0] = (code *)0x133ade;
    cVar1 = bson_init_from_json(piVar25,pcVar8,0xffffffffffffffff,piVar27);
    if (cVar1 != '\0') break;
    if (iStack_21b8 != 1) goto LAB_00133b5e;
    if (iStack_21b4 != 1) goto LAB_00133b51;
    apcStack_2308[0] = (code *)0x133b05;
    pcVar8 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar8 == (char *)0x0) goto LAB_00133b56;
    pcVar8 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
    if (pcVar8 == (char *)0x0) {
      return;
    }
  }
LAB_00133b3a:
  apcStack_2308[0] = (code *)0x133b3f;
  test_bson_json_nan_cold_9();
LAB_00133b3f:
  apcStack_2308[0] = (code *)0x133b44;
  test_bson_json_nan_cold_5();
LAB_00133b44:
  apcStack_2308[0] = (code *)0x133b4c;
  test_bson_json_nan_cold_10();
LAB_00133b4c:
  apcStack_2308[0] = (code *)0x133b51;
  test_bson_json_nan_cold_4();
LAB_00133b51:
  apcStack_2308[0] = (code *)0x133b56;
  test_bson_json_nan_cold_7();
LAB_00133b56:
  apcStack_2308[0] = (code *)0x133b5e;
  test_bson_json_nan_cold_8();
LAB_00133b5e:
  apcStack_2308[0] = test_bson_json_infinity;
  test_bson_json_nan_cold_6();
  pcVar8 = "{ \"d\": Infinity }";
  ppuVar26 = &PTR_anon_var_dwarf_1b023_001633b8;
  piStack_2330 = __haystack;
  pdStack_2328 = (double *)pcVar22;
  ppuStack_2320 = ppuVar23;
  piStack_2318 = piVar25;
  piStack_2310 = piVar27;
  apcStack_2308[0] = (code *)&pcStack_1f08;
  do {
    apcStack_2708[0] = (code *)0x133bb4;
    cVar1 = bson_init_from_json(auStack_2680,pcVar8,0xffffffffffffffff,&iStack_25b8);
    if (cVar1 == '\0') {
      apcStack_2708[0] = (code *)0x133dd5;
      test_bson_json_infinity_cold_1();
LAB_00133dd5:
      apcStack_2708[0] = (code *)0x133dda;
      test_bson_json_infinity_cold_2();
LAB_00133dda:
      apcStack_2708[0] = (code *)0x133ddf;
      test_bson_json_infinity_cold_3();
      goto LAB_00133ddf;
    }
    apcStack_2708[0] = (code *)0x133bc1;
    __haystack = (int *)bson_bcone_magic();
    apcStack_2708[0] = (code *)0x133bdf;
    cVar1 = bcon_extract(auStack_2680,"d",__haystack,1,&puStack_2688,0);
    if (cVar1 == '\0') goto LAB_00133dd5;
    if ((NAN((double)puStack_2688)) ||
       (!NAN((double)puStack_2688 - (double)puStack_2688) &&
        !NAN((double)puStack_2688 - (double)puStack_2688))) goto LAB_00133dda;
    apcStack_2708[0] = (code *)0x133c0d;
    bson_destroy(auStack_2680);
    pcVar8 = *ppuVar26;
    ppuVar26 = ppuVar26 + 1;
  } while (pcVar8 != (char *)0x0);
  pcVar22 = "{ \"d\": -Infinity }";
  ppuVar26 = &PTR_anon_var_dwarf_1b047_001633d8;
  do {
    apcStack_2708[0] = (code *)0x133c52;
    cVar1 = bson_init_from_json(auStack_2680,pcVar22,0xffffffffffffffff,&iStack_25b8);
    if (cVar1 == '\0') goto LAB_00133ddf;
    apcStack_2708[0] = (code *)0x133c75;
    cVar1 = bcon_extract(auStack_2680,"d",__haystack,1,&puStack_2688,0);
    if (cVar1 == '\0') goto LAB_00133de4;
    if ((NAN((double)puStack_2688)) || (!NAN((double)puStack_2688 - (double)puStack_2688)))
    goto LAB_00133de9;
    if (0.0 <= (double)puStack_2688) goto LAB_00133dee;
    apcStack_2708[0] = (code *)0x133cb5;
    bson_destroy(auStack_2680);
    pcVar22 = *ppuVar26;
    ppuVar26 = ppuVar26 + 1;
  } while (pcVar22 != (char *)0x0);
  pcVar8 = "{ \"d\": Infinityy }";
  ppuVar23 = &PTR_anon_var_dwarf_1b06b_001633f8;
  __haystack = aiStack_25b0;
  ppuVar26 = (undefined **)&iStack_25b8;
  pcVar22 = "Got parse error at";
  do {
    apcStack_2708[0] = (code *)0x133d04;
    cVar1 = bson_init_from_json(auStack_2680,pcVar8,0xffffffffffffffff,ppuVar26);
    if (cVar1 != '\0') goto LAB_00133df3;
    if (iStack_25b8 != 1) goto LAB_00133e0a;
    if (iStack_25b4 != 1) goto LAB_00133dfd;
    apcStack_2708[0] = (code *)0x133d37;
    pcVar8 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar8 == (char *)0x0) goto LAB_00133e02;
    pcVar8 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
  } while (pcVar8 != (char *)0x0);
  pcVar8 = "{ \"d\": In";
  ppuVar23 = &PTR_anon_var_dwarf_1b0cb_00163448;
  ppuVar26 = (undefined **)&iStack_25b8;
  pcVar22 = "Incomplete JSON";
  while( true ) {
    apcStack_2708[0] = (code *)0x133d84;
    cVar1 = bson_init_from_json(auStack_2680,pcVar8,0xffffffffffffffff,ppuVar26);
    if (cVar1 != '\0') break;
    if (iStack_25b8 != 1) goto LAB_00133e1c;
    if (iStack_25b4 != 1) goto LAB_00133e0f;
    apcStack_2708[0] = (code *)0x133daf;
    pcVar8 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar8 == (char *)0x0) goto LAB_00133e14;
    pcVar8 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
    if (pcVar8 == (char *)0x0) {
      return;
    }
  }
LAB_00133df8:
  apcStack_2708[0] = (code *)0x133dfd;
  test_bson_json_infinity_cold_13();
LAB_00133dfd:
  apcStack_2708[0] = (code *)0x133e02;
  test_bson_json_infinity_cold_9();
LAB_00133e02:
  apcStack_2708[0] = (code *)0x133e0a;
  test_bson_json_infinity_cold_14();
LAB_00133e0a:
  apcStack_2708[0] = (code *)0x133e0f;
  test_bson_json_infinity_cold_8();
LAB_00133e0f:
  apcStack_2708[0] = (code *)0x133e14;
  test_bson_json_infinity_cold_11();
LAB_00133e14:
  apcStack_2708[0] = (code *)0x133e1c;
  test_bson_json_infinity_cold_12();
LAB_00133e1c:
  puVar10 = auStack_2680;
  apcStack_2708[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_2a88 = (code *)0x133e4e;
  apcStack_2708[0] = (code *)apcStack_2308;
  cVar1 = bson_init_from_json(auStack_2a80,"{ \"x\": null }",0xffffffffffffffff,auStack_2990);
  if (cVar1 == '\0') {
    pcStack_2a88 = (code *)0x133e89;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_2a88 = (code *)0x133e57;
    uVar5 = bson_bcone_magic();
    pcStack_2a88 = (code *)0x133e73;
    cVar1 = bcon_extract(auStack_2a80,"x",uVar5,9,0);
    if (cVar1 != '\0') {
      pcStack_2a88 = (code *)0x133e7f;
      bson_destroy(auStack_2a80);
      return;
    }
  }
  pcStack_2a88 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_2e88 = (code *)0x0;
  pcStack_2e90 = "}";
  acStack_2ea0[8] = -0x2e;
  acStack_2ea0[9] = '>';
  acStack_2ea0[10] = '\x13';
  acStack_2ea0[0xb] = '\0';
  acStack_2ea0[0xc] = '\0';
  acStack_2ea0[0xd] = '\0';
  acStack_2ea0[0xe] = '\0';
  acStack_2ea0[0xf] = '\0';
  piStack_2ab0 = __haystack;
  pcStack_2aa8 = pcVar22;
  ppuStack_2aa0 = ppuVar23;
  puStack_2a98 = puVar10;
  ppuStack_2a90 = ppuVar26;
  pcStack_2a88 = (code *)apcStack_2708;
  uVar18 = bcon_new(0,"a","{","b","{");
  uStack_2d90 = 0;
  uStack_2d88 = 0;
  uStack_2da0 = 0;
  uStack_2d98 = 0;
  uStack_2db0 = 0;
  uStack_2da8 = 0;
  uStack_2dc0 = 0;
  uStack_2db8 = 0;
  uStack_2dd0 = 0;
  uStack_2dc8 = 0;
  uStack_2de0 = 0;
  uStack_2dd8 = 0;
  uStack_2df0 = 0;
  uStack_2de8 = 0;
  uStack_2e00 = (undefined *)0x500000003;
  uStack_2df8 = 5;
  pcStack_2e88 = (code *)0x133f2f;
  cVar1 = bson_init_from_json(&uStack_2e00,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_2d38);
  if (cVar1 != '\0') {
    pcStack_2e88 = (code *)0x133f47;
    ppuVar26 = (undefined **)bson_get_data(&uStack_2e00);
    pcStack_2e88 = (code *)0x133f52;
    puVar10 = (undefined1 *)bson_get_data(uVar18);
    if (*(int *)(uVar18 + 4) == uStack_2e00._4_4_) {
      pcStack_2e88 = (code *)0x133f67;
      pvVar6 = (void *)bson_get_data(uVar18);
      pcStack_2e88 = (code *)0x133f77;
      pvVar24 = (void *)bson_get_data(&uStack_2e00);
      pcStack_2e88 = (code *)0x133f85;
      iVar2 = bcmp(pvVar6,pvVar24,(ulong)*(uint *)(uVar18 + 4));
      if (iVar2 == 0) {
        pcStack_2e88 = (code *)0x133f96;
        bson_destroy(&uStack_2e00);
        pcStack_2e88 = (code *)0x133f9e;
        bson_destroy(uVar18);
        return;
      }
    }
    ppuVar23 = (undefined **)&uStack_2e00;
    pcStack_2e88 = (code *)0x133fbf;
    pcVar22 = (char *)bson_as_canonical_extended_json(ppuVar23);
    pcStack_2e88 = (code *)0x133fcc;
    uVar5 = bson_as_canonical_extended_json(uVar18);
    uVar3 = *(uint *)(uVar18 + 4);
    if (uStack_2e00._4_4_ != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (*(char *)((long)ppuVar26 + uVar20) != puVar10[uVar20]) goto LAB_0013409c;
        uVar20 = uVar20 + 1;
      } while (uStack_2e00._4_4_ != (uint)uVar20);
    }
    uVar4 = uStack_2e00._4_4_;
    if (uStack_2e00._4_4_ < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_2e88 = (code *)0x134018;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,pcVar22,uVar5);
      pcStack_2e88 = (code *)0x134030;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      pcVar22 = (char *)(ulong)uVar3;
      pcStack_2e88 = (code *)0x13404b;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_2e04 = uVar3;
      if (uVar3 == 0xffffffff) break;
      ppuVar23 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_001340a8;
      pcVar22 = (char *)((ulong)uStack_2e00 >> 0x20);
      pcStack_2e88 = (code *)0x134075;
      pcVar8 = (char *)write(uVar3,ppuVar26,(size_t)pcVar22);
      if (pcVar8 != pcVar22) goto LAB_001340ad;
      uVar18 = (ulong)*(uint *)(uVar18 + 4);
      pcStack_2e88 = (code *)0x13408b;
      uVar20 = write(uVar4,puVar10,uVar18);
      if (uVar20 != uVar18) goto LAB_001340b2;
      uVar20 = (ulong)uVar4;
      pcStack_2e88 = (code *)0x13409c;
      test_bson_json_empty_final_object_cold_4();
      uVar5 = extraout_RAX_02;
LAB_0013409c:
      uVar20 = uVar20 & 0xffffffff;
    }
    pcStack_2e88 = (code *)0x1340a8;
    test_bson_json_empty_final_object_cold_6();
LAB_001340a8:
    pcStack_2e88 = (code *)0x1340ad;
    test_bson_json_empty_final_object_cold_5();
LAB_001340ad:
    pcStack_2e88 = (code *)0x1340b2;
    test_bson_json_empty_final_object_cold_2();
LAB_001340b2:
    pcStack_2e88 = (code *)0x1340b7;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_2e88 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar8 = acStack_2ea0;
  acStack_2ea0[8] = '\0';
  acStack_2ea0[9] = '\0';
  acStack_2ea0[10] = '\0';
  acStack_2ea0[0xb] = '\0';
  acStack_2ea0[0xc] = '\0';
  acStack_2ea0[0xd] = '\0';
  acStack_2ea0[0xe] = '@';
  acStack_2ea0[0xf] = '0';
  acStack_2ea0[0] = '\v';
  acStack_2ea0[1] = '\0';
  acStack_2ea0[2] = '\0';
  acStack_2ea0[3] = '\0';
  acStack_2ea0[4] = '\0';
  acStack_2ea0[5] = '\0';
  acStack_2ea0[6] = '\0';
  acStack_2ea0[7] = '\0';
  pcStack_2eb0 = (code *)0x1340ea;
  pcStack_2e90 = (char *)uVar18;
  pcStack_2e88 = (code *)puVar10;
  plVar14 = (long *)bson_new();
  pcStack_2eb0 = (code *)0x134104;
  cVar1 = bson_append_decimal128(plVar14,"decimal128",0xffffffff,pcVar8);
  if (cVar1 == '\0') {
    pcStack_2eb0 = (code *)0x134152;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_2eb0 = (code *)0x134113;
    pcVar8 = (char *)bson_as_json(plVar14,auStack_2ea8);
    if (pcVar8 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00134135:
      pcStack_2eb0 = (code *)0x13413d;
      bson_free(pcVar8);
      pcStack_2eb0 = (code *)0x134145;
      bson_destroy(plVar14);
      return;
    }
    pcStack_2eb0 = (code *)0x134131;
    iVar2 = strcmp(pcVar8,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00134135;
  }
  pcStack_2eb0 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar29 = &pcStack_2eb0;
  ppuStack_3308 = (undefined **)0x13418d;
  plStack_2eb8 = plVar14;
  pcStack_2eb0 = (code *)&pcStack_2a88;
  cVar1 = bson_init_from_json(auStack_3200,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_3118);
  if (cVar1 == '\0') goto LAB_00134231;
  ppuStack_3308 = (undefined **)0x1341aa;
  cVar1 = bson_iter_init(auStack_3280,auStack_3200);
  if (cVar1 == '\0') {
    ppuStack_3308 = (undefined **)0x13421d;
    test_bson_json_number_decimal_cold_2();
LAB_0013421d:
    ppuStack_3308 = (undefined **)0x134222;
    test_bson_json_number_decimal_cold_3();
LAB_00134222:
    ppuStack_3308 = (undefined **)0x134227;
    test_bson_json_number_decimal_cold_4();
LAB_00134227:
    ppuStack_3308 = (undefined **)0x13422c;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    ppuStack_3308 = (undefined **)0x1341c2;
    cVar1 = bson_iter_find(auStack_3280,"key");
    if (cVar1 == '\0') goto LAB_0013421d;
    ppuStack_3308 = (undefined **)0x1341d3;
    iVar2 = bson_iter_type(auStack_3280);
    if (iVar2 != 0x13) goto LAB_00134222;
    plVar14 = &lStack_3290;
    ppuStack_3308 = (undefined **)0x1341ed;
    bson_iter_decimal128(auStack_3280,plVar14);
    if (lStack_3290 != 0xb) goto LAB_00134227;
    if (lStack_3288 == 0x3040000000000000) {
      ppuStack_3308 = (undefined **)0x134211;
      bson_destroy(auStack_3200);
      return;
    }
  }
  ppuStack_3308 = (undefined **)0x134231;
  test_bson_json_number_decimal_cold_6();
LAB_00134231:
  ppuStack_3308 = (undefined **)test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar19 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar21 = &PTR_anon_var_dwarf_1b1c7_00163470;
  plStack_3320 = plVar14;
  pcStack_3318 = pcVar22;
  pcStack_3310 = pcVar8;
  ppuStack_3308 = ppuVar26;
  do {
    pcStack_3530 = (code *)0x134273;
    lVar17 = bson_new_from_json(pcVar19,0xffffffffffffffff,&iStack_3520);
    if (lVar17 != 0) {
      pcStack_3530 = (code *)0x1342c0;
      test_bson_json_errors_cold_1();
LAB_001342c0:
      pcStack_3530 = (code *)0x1342de;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_3518,
              ppuVar26);
      pcStack_3530 = (code *)0x1342e3;
      abort();
    }
    if (iStack_3520 != 1) {
LAB_001342e8:
      pcStack_3530 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_3748 = (code *)0x13430d;
      pcStack_3538 = acStack_3518;
      pcStack_3530 = (code *)&iStack_3520;
      pcVar22 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                           auStack_3738);
      pcStack_3748 = (code *)0x13431a;
      pcVar8 = (char *)bson_as_json(pcVar22,0);
      if (pcVar8 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_0013433c:
        pcStack_3748 = (code *)0x134344;
        bson_free(pcVar8);
        pcStack_3748 = (code *)0x13434c;
        bson_destroy(pcVar22);
        return;
      }
      pcStack_3748 = (code *)0x134338;
      iVar2 = strcmp(pcVar8,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_0013433c;
      pcStack_3748 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_3958 = 0x2200223a2261227b;
      uStack_3950 = 0x7d;
      uStack_395c = 0x227b;
      pcStack_3748 = (code *)pcVar22;
      lVar17 = bson_new_from_json(&uStack_3958,9,&iStack_3948);
      if (lVar17 == 0) {
        if (iStack_3948 != 1) goto LAB_00134418;
        if (iStack_3944 != 1) goto LAB_0013441d;
        pcVar22 = acStack_3940;
        pcVar19 = strstr(pcVar22,"Got parse error");
        if (pcVar19 == (char *)0x0) goto LAB_00134422;
        lVar17 = bson_new_from_json(&uStack_395c,3,&iStack_3948);
        if (lVar17 != 0) goto LAB_00134413;
        if (iStack_3948 != 1) goto LAB_0013442a;
        if (iStack_3944 == 1) {
          pcVar19 = strstr(pcVar22,"Got parse error");
          if (pcVar19 != (char *)0x0) {
            return;
          }
          goto LAB_00134434;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_00134413:
        test_bson_json_null_in_str_cold_4();
LAB_00134418:
        test_bson_json_null_in_str_cold_2();
LAB_0013441d:
        test_bson_json_null_in_str_cold_3();
LAB_00134422:
        test_bson_json_null_in_str_cold_8();
LAB_0013442a:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00134434:
      test_bson_json_null_in_str_cold_7();
      uVar5 = extraout_RAX_03;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar11 = bson_bcon_magic();
      uVar5 = bcon_new(0,"a",uVar11,0xf,1,0,uVar5,pcVar22,ppuVar21,ppuVar23,pcVar8,ppuVar26,ppcVar29
                      );
      uVar15 = bcon_new(0,"b",uVar11,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar5,uVar15,0);
      uVar5 = bson_new();
      uVar15 = bson_new();
      uVar16 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar5,uVar15,uVar16,0);
      uVar5 = bcon_new(0,"a",uVar11,0xf,1,"b",uVar11,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar11,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar11,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar11,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar5,0);
      uVar5 = bson_new();
      _test_json_produces_multiple("[]",0,uVar5,0);
      uVar5 = bcon_new(0,"0","{","x",uVar11,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar5,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_351c != 2) {
      pcStack_3530 = (code *)0x1342e8;
      test_bson_json_errors_cold_3();
      goto LAB_001342e8;
    }
    ppuVar26 = (undefined **)ppuVar21[-1];
    pcStack_3530 = (code *)0x13429a;
    pcVar22 = strstr(acStack_3518,(char *)ppuVar26);
    if (pcVar22 == (char *)0x0) goto LAB_001342c0;
    pcVar19 = *ppuVar21;
    ppuVar21 = ppuVar21 + 2;
    if (pcVar19 == (char *)0x0) {
      return;
    }
  } while( true );
  while( true ) {
    if (*(char *)((long)pvStack_7f8 + uVar18) != *(char *)((long)pvVar7 + uVar18))
    goto LAB_00132c91;
    uVar18 = uVar18 + 1;
    if (uStack_77c == (uint)uVar18) break;
LAB_00132bcf:
    if (uVar3 == (uint)uVar18) break;
  }
LAB_00132be8:
  uVar4 = uStack_77c;
  if (uStack_77c < uVar3) {
    uVar4 = uVar3;
  }
  uVar18 = (ulong)(uVar4 - 1);
  while( true ) {
    pcStack_808 = (code *)0x132c0d;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar18,__n,uVar5);
    pcStack_808 = (code *)0x132c25;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    __n = (undefined1 *)(ulong)uVar3;
    pcStack_808 = (code *)0x132c40;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_7fc = uVar3;
    if (uVar3 == 0xffffffff) break;
    puVar10 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00132c9d;
    __n = (undefined1 *)(ulong)uStack_77c;
    pcStack_808 = (code *)0x132c6a;
    puVar12 = (undefined1 *)write(uVar3,pvVar6,(size_t)__n);
    if (puVar12 != __n) goto LAB_00132ca2;
    puVar13 = (undefined1 *)(ulong)*(uint *)(puVar13 + 4);
    pcStack_808 = (code *)0x132c80;
    puVar12 = (undefined1 *)write(uVar4,pvVar7,(size_t)puVar13);
    if (puVar12 != puVar13) goto LAB_00132ca7;
    uVar18 = (ulong)uVar4;
    pcStack_808 = (code *)0x132c91;
    test_bson_json_uescape_cold_4();
    uVar5 = extraout_RAX_00;
LAB_00132c91:
    uVar18 = uVar18 & 0xffffffff;
  }
  pcStack_808 = (code *)0x132c9d;
  test_bson_json_uescape_cold_6();
LAB_00132c9d:
  pcStack_808 = (code *)0x132ca2;
  test_bson_json_uescape_cold_5();
LAB_00132ca2:
  pcStack_808 = (code *)0x132ca7;
  test_bson_json_uescape_cold_2();
LAB_00132ca7:
  pcStack_808 = (code *)0x132cac;
  test_bson_json_uescape_cold_3();
  goto LAB_00132cac;
LAB_00133b35:
  apcStack_2308[0] = (code *)0x133b3a;
  test_bson_json_nan_cold_11();
  goto LAB_00133b3a;
LAB_00133ddf:
  apcStack_2708[0] = (code *)0x133de4;
  test_bson_json_infinity_cold_4();
LAB_00133de4:
  apcStack_2708[0] = (code *)0x133de9;
  test_bson_json_infinity_cold_5();
LAB_00133de9:
  apcStack_2708[0] = (code *)0x133dee;
  test_bson_json_infinity_cold_6();
LAB_00133dee:
  ppuVar23 = &puStack_2688;
  pcVar22 = "d";
  apcStack_2708[0] = (code *)0x133df3;
  test_bson_json_infinity_cold_7();
LAB_00133df3:
  apcStack_2708[0] = (code *)0x133df8;
  test_bson_json_infinity_cold_15();
  goto LAB_00133df8;
}

Assistant:

static void
test_bson_json_dbref (void)
{
   bson_error_t error;

   const char *json_with_objectid =
      "{ \"key\": {"
      "\"$ref\": \"collection\","
      "\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";

   bson_t *bson_with_objectid = BCON_NEW ("key",
                                          "{",
                                          "$ref",
                                          BCON_UTF8 ("collection"),
                                          "$id",
                                          BCON_OID (oid_zero ()),
                                          "}");

   const char *json_with_int_id = "{ \"key\": {"
                                  "\"$ref\": \"collection\","
                                  "\"$id\": 1}}";

   bson_t *bson_with_int_id = BCON_NEW (
      "key", "{", "$ref", BCON_UTF8 ("collection"), "$id", BCON_INT32 (1), "}");

   const char *json_with_subdoc_id = "{ \"key\": {"
                                     "\"$ref\": \"collection\","
                                     "\"$id\": {\"a\": 1}}}";

   bson_t *bson_with_subdoc_id = BCON_NEW ("key",
                                           "{",
                                           "$ref",
                                           BCON_UTF8 ("collection"),
                                           "$id",
                                           "{",
                                           "a",
                                           BCON_INT32 (1),
                                           "}",
                                           "}");

   const char *json_with_metadata = "{ \"key\": {"
                                    "\"$ref\": \"collection\","
                                    "\"$id\": 1,"
                                    "\"meta\": true}}";

   bson_t *bson_with_metadata = BCON_NEW ("key",
                                          "{",
                                          "$ref",
                                          BCON_UTF8 ("collection"),
                                          "$id",
                                          BCON_INT32 (1),
                                          "meta",
                                          BCON_BOOL (true),
                                          "}");

   bson_t b;
   bool r;

   typedef struct {
      const char *json;
      bson_t *expected_bson;
   } dbref_test_t;

   dbref_test_t tests[] = {
      {json_with_objectid, bson_with_objectid},
      {json_with_int_id, bson_with_int_id},
      {json_with_subdoc_id, bson_with_subdoc_id},
      {json_with_metadata, bson_with_metadata},
   };

   int n_tests = sizeof (tests) / sizeof (dbref_test_t);
   int i;

   for (i = 0; i < n_tests; i++) {
      r = bson_init_from_json (&b, tests[i].json, -1, &error);
      if (!r) {
         fprintf (stderr, "%s\n", error.message);
      }

      BSON_ASSERT (r);
      bson_eq_bson (&b, tests[i].expected_bson);
      bson_destroy (&b);
   }

   for (i = 0; i < n_tests; i++) {
      bson_destroy (tests[i].expected_bson);
   }
}